

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-solver.cpp
# Opt level: O3

bool __thiscall
baryonyx::itm::
solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>
::
compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
          (solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>
           *this,bit_array *x,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> last,float kappa,
          float delta,float theta)

{
  float *pfVar1;
  _Head_base<0UL,_float_*,_false> _Var2;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  undefined8 uVar3;
  bool bVar4;
  uint uVar5;
  _Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>::rc_data_*,_false>
  _Var6;
  _Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>::bound_factor_*,_false>
  _Var7;
  row_value rVar8;
  undefined8 extraout_RAX;
  int iVar9;
  int iVar10;
  long lVar11;
  int *piVar12;
  type it;
  rc_data *__last;
  long lVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  rc_data *ret;
  _Head_base<0UL,_int_*,_false> _Var17;
  int *piVar18;
  long lVar19;
  float fVar20;
  float fVar21;
  double dVar22;
  undefined1 auVar23 [16];
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 in_register_00001304 [12];
  undefined1 local_98 [16];
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_88;
  long local_80;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false> local_78;
  float local_6c;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::col_value,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
  local_68;
  long local_60;
  int *local_58;
  int *local_50;
  long local_48;
  unique_ptr<int[],_std::default_delete<int[]>_> local_40;
  _Head_base<0UL,_int_*,_false> local_38;
  
  if (first._M_current != last._M_current) {
    local_68._M_t.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl =
         (tuple<baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
          )((long)this + 8);
    fVar20 = kappa / (1.0 - kappa);
    local_78._M_head_impl = (row_value *)this;
    local_6c = theta;
    local_58 = last._M_current;
    do {
      lVar11 = (long)*first._M_current;
      if (((solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
            *)this)->m <= *first._M_current) {
        compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                  ();
        goto LAB_00152483;
      }
      local_50 = first._M_current;
      sparse_matrix<int>::row
                ((sparse_matrix<int> *)local_98,
                 (int)local_68._M_t.
                      super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
                      .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>.
                      _M_head_impl);
      _Var17._M_head_impl = (int *)0x0;
      local_80 = lVar11;
      if (local_98._8_8_ != local_98._0_8_) {
        _Var2._M_head_impl =
             (((solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
                *)this)->P)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
             super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
             super__Head_base<0UL,_float_*,_false>._M_head_impl;
        _Var17._M_head_impl = (int *)local_98._8_8_;
        do {
          iVar15 = *_Var17._M_head_impl;
          _Var17._M_head_impl = _Var17._M_head_impl + 8;
          _Var2._M_head_impl[iVar15] = local_6c * _Var2._M_head_impl[iVar15];
        } while (_Var17._M_head_impl != (int *)local_98._0_8_);
        _Var17._M_head_impl = (int *)0x0;
        if (local_98._8_8_ != local_98._0_8_) {
          uVar5 = 1;
          piVar12 = (int *)local_98._8_8_;
          _Var17._M_head_impl = (int *)0x0;
          do {
            piVar18 = _Var17._M_head_impl;
            uVar16 = (ulong)uVar5;
            sparse_matrix<int>::column
                      ((sparse_matrix<int> *)&local_40,
                       (int)local_68._M_t.
                            super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
                            .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>
                            ._M_head_impl);
            _Var17._M_head_impl =
                 (((solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
                    *)this)->A)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl;
            if ((__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)local_38._M_head_impl
                == (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)
                   local_40._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                   super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl) {
              fVar24 = 0.0;
            }
            else {
              auVar25 = ZEXT816(0) << 0x40;
              do {
                iVar15 = *local_38._M_head_impl;
                local_38._M_head_impl = local_38._M_head_impl + 2;
                auVar23._0_4_ = (float)_Var17._M_head_impl[iVar15];
                auVar23._4_12_ = in_register_00001304;
                auVar25 = vfmadd231ss_fma(auVar25,auVar23,
                                          ZEXT416((uint)(((
                                                  solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
                                                  *)this)->P)._M_t.
                                                  super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                                  .super__Head_base<0UL,_float_*,_false>.
                                                  _M_head_impl[iVar15]));
              } while ((__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                       local_38._M_head_impl !=
                       (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)
                       local_40._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                       super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                       super__Head_base<0UL,_int_*,_false>._M_head_impl);
              fVar24 = auVar25._0_4_;
            }
            _Var6._M_head_impl =
                 (((solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
                    *)this)->R)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>::rc_data[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>::rc_data_*,_false>
                 ._M_head_impl;
            *(int *)((long)(_Var6._M_head_impl + (long)piVar18) + 4) = (int)piVar18;
            *(int *)((long)(_Var6._M_head_impl + (long)piVar18) + 8) = _Var17._M_head_impl[*piVar12]
            ;
            fVar21 = quadratic_cost_type<float>::operator()
                               (((solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
                                  *)this)->c,*(int *)(local_98._8_8_ + 4),x);
            _Var6._M_head_impl =
                 (((solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
                    *)this)->R)._M_t.
                 super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>::rc_data[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>::rc_data_*,_false>
                 ._M_head_impl;
            piVar12 = piVar12 + 2;
            uVar5 = uVar5 + 1;
            _Var6._M_head_impl[(long)piVar18].value = fVar21 - fVar24;
            _Var17._M_head_impl = piVar18 + 1;
          } while (piVar12 != (int *)local_98._0_8_);
          if (piVar18 != (int *)0x0) {
            __g = ((solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
                    *)this)->rng;
            std::
            __introsort_loop<baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>::rc_data*>(baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>::rc_data*,baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                      (_Var6._M_head_impl,
                       _Var6._M_head_impl + ((ulong)_Var17._M_head_impl & 0xffffffff),
                       (int)LZCOUNT((ulong)_Var17._M_head_impl & 0xffffffff) * 2 ^ 0x7e);
            std::
            __final_insertion_sort<baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>::rc_data*>(baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>::rc_data*,baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                      (_Var6._M_head_impl,
                       _Var6._M_head_impl + ((ulong)_Var17._M_head_impl & 0xffffffff));
            __last = _Var6._M_head_impl + 1;
            lVar11 = uVar16 * 0xc + -0xc;
            do {
              if (((_Var6._M_head_impl)->value != __last->value) ||
                 (NAN((_Var6._M_head_impl)->value) || NAN(__last->value))) {
                std::
                shuffle<baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                          (_Var6._M_head_impl,__last,__g);
                _Var6._M_head_impl = __last;
              }
              __last = __last + 1;
              lVar11 = lVar11 + -0xc;
            } while (lVar11 != 0);
            std::
            shuffle<baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                      (_Var6._M_head_impl,__last,__g);
          }
        }
      }
      _Var7._M_head_impl =
           (((solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
              *)this)->b)._M_t.
           super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>::bound_factor,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>::bound_factor[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>::bound_factor[]>_>
           .
           super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>::bound_factor_*,_false>
           ._M_head_impl;
      local_60 = local_80 * 3;
      local_88._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
      super__Head_base<0UL,_int_*,_false>._M_head_impl =
           (tuple<int_*,_std::default_delete<int[]>_>)
           (tuple<int_*,_std::default_delete<int[]>_>)_Var17._M_head_impl;
      if (_Var7._M_head_impl[local_80].min < 1) {
        lVar11 = 0xffffffff;
        iVar15 = 0;
LAB_0015227a:
        uVar5 = (uint)lVar11;
        iVar9 = uVar5 + 1;
        iVar10 = (int)local_88._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                      super__Head_base<0UL,_int_*,_false>._M_head_impl;
        if ((iVar9 < iVar10) && (iVar15 <= (&(_Var7._M_head_impl)->max)[local_60])) {
          rVar8 = *(row_value *)((long)this + 0x50);
          lVar14 = (long)(int)uVar5 * 0xc;
          lVar19 = (long)(int)uVar5 + 1;
          do {
            lVar11 = lVar19;
            iVar15 = iVar15 + *(int *)((long)rVar8 + 0x14 + lVar14);
            if (iVar15 < *(int *)((long)*(row_value *)((long)this + 0x58) + local_60 * 4)) {
              piVar12 = (int *)(local_98._8_8_ + (long)*(int *)((long)rVar8 + 0x10 + lVar14) * 2 * 4
                               );
LAB_00152377:
              bit_array_impl::unset(&x->super_bit_array_impl,piVar12[1]);
              auVar25 = vfmadd213ss_fma(ZEXT416((uint)(*(float *)((long)*(row_value *)
                                                                         ((long)this + 0x50) + 0xc +
                                                                 lVar14) * 0.5)),
                                        ZEXT416((uint)fVar20),ZEXT416((uint)delta));
              *(float *)((long)*(row_value *)((long)this + 0x68) + (long)*piVar12 * 4) =
                   *(float *)((long)*(row_value *)((long)this + 0x68) + (long)*piVar12 * 4) -
                   auVar25._0_4_;
              break;
            }
            piVar12 = (int *)(local_98._8_8_ + (long)*(int *)((long)rVar8 + 0x10 + lVar14) * 2 * 4);
            if (*(int *)((long)*(row_value *)((long)this + 0x58) + local_60 * 4 + 4) < iVar15)
            goto LAB_00152377;
            fVar24 = *(float *)((long)rVar8 + 0xc + lVar14);
            if ((fVar24 != 0.0) || (NAN(fVar24))) {
              if (0.0 <= fVar24) goto LAB_00152377;
            }
            else {
              dVar22 = std::
                       generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                                 ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                   *)*(row_value *)this);
              if (0.5 <= dVar22) goto LAB_00152377;
            }
            bit_array_impl::set(&x->super_bit_array_impl,piVar12[1]);
            rVar8 = *(row_value *)((long)this + 0x50);
            pfVar1 = (float *)((long)rVar8 + 0xc + lVar14);
            lVar14 = lVar14 + 0xc;
            auVar25 = vfmadd213ss_fma(ZEXT416((uint)(*pfVar1 * 0.5)),ZEXT416((uint)fVar20),
                                      ZEXT416((uint)delta));
            *(float *)((long)*(row_value *)((long)this + 0x68) + (long)*piVar12 * 4) =
                 auVar25._0_4_ +
                 *(float *)((long)*(row_value *)((long)this + 0x68) + (long)*piVar12 * 4);
            lVar19 = lVar11 + 1;
          } while (lVar11 + 1 < (long)iVar10);
          goto LAB_001523bc;
        }
      }
      else {
        _Var6._M_head_impl =
             (((solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
                *)this)->R)._M_t.
             super___uniq_ptr_impl<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>::rc_data,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>::rc_data[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>::rc_data_*,_std::default_delete<baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>::rc_data[]>_>
             .
             super__Head_base<0UL,_baryonyx::itm::solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>::rc_data_*,_false>
             ._M_head_impl;
        lVar19 = 0;
        iVar15 = 0;
        local_48 = (long)(int)_Var17._M_head_impl + -2;
        lVar14 = -1;
        do {
          uVar3 = local_98._8_8_;
          lVar13 = (long)*(int *)((long)&(_Var6._M_head_impl)->id + lVar19);
          iVar15 = iVar15 + *(int *)((long)&(_Var6._M_head_impl)->a + lVar19);
          lVar11 = lVar14 + 1;
          iVar10 = *(int *)((long)*(row_value *)((long)this + 0x58) + local_60 * 4);
          bit_array_impl::set(&x->super_bit_array_impl,
                              *(int *)(local_98._8_8_ + (lVar13 * 2 + 1) * 4));
          _Var6._M_head_impl = *(rc_data **)((long)local_78._M_head_impl + 0x50);
          auVar25 = vfmadd213ss_fma(ZEXT416((uint)(*(float *)((long)&(_Var6._M_head_impl)->value +
                                                             lVar19) * 0.5)),ZEXT416((uint)fVar20),
                                    ZEXT416((uint)delta));
          *(float *)(*(long *)((long)local_78._M_head_impl + 0x68) +
                    (long)*(int *)(uVar3 + lVar13 * 2 * 4) * 4) =
               auVar25._0_4_ +
               *(float *)(*(long *)((long)local_78._M_head_impl + 0x68) +
                         (long)*(int *)(uVar3 + lVar13 * 2 * 4) * 4);
          this = (solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>
                  *)local_78;
          if (iVar10 <= iVar15) break;
          lVar19 = lVar19 + 0xc;
          bVar4 = lVar14 < local_48;
          lVar14 = lVar11;
        } while (bVar4);
        _Var7._M_head_impl = *(bound_factor **)((long)local_78._M_head_impl + 0x58);
        if ((&(_Var7._M_head_impl)->min)[local_60] <= iVar15) goto LAB_0015227a;
LAB_001523bc:
        uVar5 = (uint)lVar11;
        iVar9 = uVar5 + 1;
        iVar10 = (int)local_88._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                      super__Head_base<0UL,_int_*,_false>._M_head_impl;
      }
      this = (solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>
              *)local_78._M_head_impl;
      if (iVar9 < iVar10) {
        rVar8 = local_78._M_head_impl[10];
        iVar10 = ~uVar5 + iVar10;
        lVar11 = (long)(int)uVar5 * 0xc;
        do {
          uVar3 = local_98._8_8_;
          lVar14 = (long)*(int *)((long)rVar8 + 0x10 + lVar11);
          bit_array_impl::unset
                    (&x->super_bit_array_impl,*(int *)(local_98._8_8_ + (lVar14 * 2 + 1) * 4));
          rVar8 = *(row_value *)((long)this + 0x50);
          pfVar1 = (float *)((long)rVar8 + 0xc + lVar11);
          lVar11 = lVar11 + 0xc;
          iVar10 = iVar10 + -1;
          auVar25 = vfmadd213ss_fma(ZEXT416((uint)(*pfVar1 * 0.5)),ZEXT416((uint)fVar20),
                                    ZEXT416((uint)delta));
          *(float *)((long)*(row_value *)((long)this + 0x68) +
                    (long)*(int *)(uVar3 + lVar14 * 2 * 4) * 4) =
               *(float *)((long)*(row_value *)((long)this + 0x68) +
                         (long)*(int *)(uVar3 + lVar14 * 2 * 4) * 4) - auVar25._0_4_;
        } while (iVar10 != 0);
      }
      bVar4 = is_valid_constraint<baryonyx::itm::solver_random_inequalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>>,baryonyx::bit_array>
                        ((solver_random_inequalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>_>
                          *)this,(int)local_80,x);
      if (!bVar4) {
LAB_00152483:
        compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                  ();
        __clang_call_terminate(extraout_RAX);
      }
      first._M_current = local_50 + 1;
    } while (first._M_current != local_58);
  }
  return false;
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        for (; first != last; ++first) {
            auto k = constraint(first);
            bx_expects(k < m);

            auto [row_begin, row_end] = ap.row(k);
            decrease_preference(row_begin, row_end, theta);

            int r_size = 0;
            for (auto it = row_begin; it != row_end; ++it, ++r_size) {
                Float sum_a_p = 0;

                auto [col_begin, col_end] = ap.column(it->column);
                for (; col_begin != col_end; ++col_begin)
                    sum_a_p += static_cast<Float>(A[col_begin->value]) *
                               P[col_begin->value];

                R[r_size].id = r_size;
                R[r_size].a = A[it->value];
                R[r_size].value = c(row_begin->column, x) - sum_a_p;
            }

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);

            int value = 0;
            bool valid = b[k].min <= 0;
            int i = -1;

            // if (!valid) {
            //     do {
            //         ++i;
            //         value += R[i].a;
            //         valid = b[k].min <= value;
            //     } while (!valid && i + 1 < r_size);
            // }

            // valid = b[k].min <= value && value <= b[k].max;
            // while (i + 1 < r_size && valid) {
            //     ++i;
            //     value += R[i].a;
            //     valid = b[k].min <= value && value <= b[k].max;
            // }

            // std::uniform_real_distribution<Float> real_dist(Float{ 0 },
            //                                                 Float{ 1 });

            // auto selected = i;
            // auto d = delta;

            // if (selected < 0) {
            //     d += (kappa / (one - kappa)) * (R[0].value / two);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }
            // } else if (selected + 1 >= r_size) {
            //     d += (kappa / (one - kappa)) * (R[selected].value * middle);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }
            // } else {
            //     d += (kappa / (one - kappa)) *
            //          (R[selected + 1].value - R[selected].value);
            //     d *= real_dist(rng);

            //     for (i = 0; i <= selected; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }

            //     for (; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }

            constexpr Float one{ 1 };
            constexpr Float two{ 2 };

            if (!valid) {
                do {
                    ++i;
                    value += R[i].a;
                    valid = b[k].min <= value;
                    auto var = row_begin + R[i].id;
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } while (!valid && i + 1 < r_size);
            }

            valid = b[k].min <= value && value <= b[k].max;
            while (i + 1 < r_size && valid) {
                ++i;
                value += R[i].a;
                valid = b[k].min <= value && value <= b[k].max;
                auto var = row_begin + R[i].id;

                if (valid)
                    valid = stop_iterating<Mode>(R[i].value, rng);

                if (valid) {
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } else {
                    x.unset(var->column);
                    P[var->value] -=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                }
            }

            while (i + 1 < r_size) {
                ++i;
                auto var = row_begin + R[i].id;
                x.unset(var->column);
                P[var->value] -=
                  delta + (kappa / (one - kappa)) * (R[i].value / two);
            }

            bx_expects(is_valid_constraint(*this, k, x));
        }

        return false;
    }